

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void Parser::eliHide(TreeNode *treeNode)

{
  const_iterator __position;
  
  __position._M_current =
       (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    if (resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
        super__Vector_impl_data._M_start[*__position._M_current].hide == true) {
      __position._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::erase(&treeNode->sons,__position);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void eliHide(TreeNode &treeNode){
        auto it = treeNode.sons.begin();
        while(it!=treeNode.sons.end()){
            if(resultTree[*it].hide){
                it = treeNode.sons.erase(it);
            }else{
                ++it;
            }
        }
    }